

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O2

result_t benchmark_sum_dividers<int,std::vector<int,std::allocator<int>>>
                   (vector<int,_std::allocator<int>_> *dividers,size_t iters)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  int numerator;
  bool bVar5;
  result_t rVar6;
  
  sVar4 = 0;
  lVar1 = std::chrono::_V2::system_clock::now();
  while( true ) {
    numerator = (int)iters;
    bVar5 = iters == 0;
    iters = iters - 1;
    if (bVar5) break;
    if (numerator < 3) {
      numerator = 2;
    }
    sVar2 = sum_dividers<int,std::vector<int,std::allocator<int>>>(numerator,dividers);
    sVar4 = sVar4 + sVar2;
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  rVar6.duration = (double)(lVar3 - lVar1) / 1000000000.0;
  rVar6.sum = sVar4;
  return rVar6;
}

Assistant:

NOINLINE result_t benchmark_sum_dividers(const D& dividers, size_t iters) {
    auto t1 = std::chrono::system_clock::now();
    size_t sum = 0;

    for (; iters > 0; iters--) {
        // Unsigned branchfree divider cannot be 1
        T numerator = std::max((T)2, (T)iters);
        sum += sum_dividers(numerator, dividers);
    }

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    return result_t{seconds.count(), sum};
}